

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.h
# Opt level: O2

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addSupportedCapabilitiesToSet<spv_operand_desc_t>
          (TrimCapabilitiesPass *this,spv_operand_desc_t *descriptor,CapabilitySet *output)

{
  uint uVar1;
  bool bVar2;
  uint32_t i;
  ulong uVar3;
  Capability capability;
  Capability local_54;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  uVar1 = descriptor->numCapabilities;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    local_54 = descriptor->capabilities[uVar3];
    bVar2 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,local_54);
    if (bVar2) {
      EnumSet<spv::Capability>::insert(&local_50,output,&local_54);
    }
  }
  return;
}

Assistant:

inline void addSupportedCapabilitiesToSet(const Descriptor* const descriptor,
                                            CapabilitySet* output) const {
    const uint32_t capabilityCount = descriptor->numCapabilities;
    for (uint32_t i = 0; i < capabilityCount; ++i) {
      const auto capability = descriptor->capabilities[i];
      if (supportedCapabilities_.contains(capability)) {
        output->insert(capability);
      }
    }
  }